

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O0

Data processArray(fy_node *node)

{
  Data pvVar1;
  Data to_append;
  void *iter;
  fy_node *seqNode;
  Array a;
  fy_node *node_local;
  
  a = (Array)node;
  seqNode = (fy_node *)newArray();
  to_append = (Data)0x0;
  while( true ) {
    iter = fy_node_sequence_iterate((fy_node *)a,&to_append);
    if ((fy_node *)iter == (fy_node *)0x0) {
      pvVar1 = newDataArray((Array)seqNode);
      return pvVar1;
    }
    pvVar1 = parseYaml((fy_node *)iter);
    if (pvVar1 == (Data)0x0) break;
    putArray((Array)seqNode,pvVar1);
  }
  freeArray((Array)seqNode);
  return (Data)0x0;
}

Assistant:

Data processArray(struct fy_node *node) {
    Array a = newArray();
    //struct fy_node *fy_node_sequence_iterate(struct fy_node *fyn, void **prevp)
    struct fy_node *seqNode;
    void *iter = NULL;
    while ((seqNode = fy_node_sequence_iterate(node, &iter))) {
        Data to_append = parseYaml(seqNode);
        if (to_append == NULL) {
            freeArray(a);
            return NULL;
        }
        putArray(a, to_append);
    }
    return newDataArray(a);
}